

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

floatx80 commonNaNToFloatx80(commonNaNT a,float_status *status)

{
  floatx80 fVar1;
  floatx80 fVar2;
  floatx80 z;
  float_status *status_local;
  uint16_t local_10;
  
  if (status->default_nan_mode == '\0') {
    if (a.high >> 1 == 0) {
      fVar1 = floatx80_default_nan_tricore(status);
      z.low._0_2_ = fVar1.high;
    }
    else {
      fVar1._8_8_ = 0x8000000000000000;
      fVar1.low = a.high >> 1 | 0x8000000000000000;
      z.low._0_2_ = (ushort)a.sign << 0xf | 0x7fff;
    }
    local_10 = (uint16_t)z.low;
  }
  else {
    fVar1 = floatx80_default_nan_tricore(status);
    local_10 = fVar1.high;
  }
  status_local = (float_status *)fVar1.low;
  fVar2._10_6_ = fVar1._10_6_;
  fVar2.high = local_10;
  fVar2.low = (uint64_t)status_local;
  return fVar2;
}

Assistant:

static floatx80 commonNaNToFloatx80(commonNaNT a, float_status *status)
{
    floatx80 z;

    if (status->default_nan_mode) {
        return floatx80_default_nan(status);
    }

    if (a.high >> 1) {
        z.low = UINT64_C(0x8000000000000000) | a.high >> 1;
        z.high = (((uint16_t)a.sign) << 15) | 0x7FFF;
    } else {
        z = floatx80_default_nan(status);
    }
    return z;
}